

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O3

bool __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPointAtLevel
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,Image<const_unsigned_short> *img_2,
          PatchT *dp,AffineCompact2f *transform)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  long lVar10;
  ActualDstType actualDst;
  ulong uVar11;
  float fVar12;
  double __x;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Vector3 inc;
  Matrix2P transformed_pat;
  VectorP res;
  assign_op<float,_float> local_339;
  Matrix3P *local_338;
  OpticalFlowPatch<float,_vo::Pattern51<float>_> *local_330;
  ulong local_328;
  plainobjectbase_evaluator_data<float,_0> local_320;
  undefined1 local_318 [8];
  undefined8 uStack_310;
  assign_op<float,_float> *local_308;
  DstXprType *local_300;
  undefined8 local_2f8;
  float fStack_2f0;
  float fStack_2ec;
  VectorP *local_2e8;
  Matrix3P *local_2d8;
  VectorP *local_2d0;
  undefined8 local_2c8;
  DstXprType local_2b4;
  Matrix2P local_2a8;
  VectorP local_108;
  
  local_338 = &dp->H_se2_inv_J_se2_T;
  uVar11 = 0;
  local_330 = dp;
  while( true ) {
    fVar12 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[0];
    fVar13 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[3];
    fVar14 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[1];
    fVar15 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[2];
    lVar10 = 0;
    do {
      fVar16 = *(float *)((long)&OpticalFlowPatch<float,vo::Pattern51<float>>::pattern2 + lVar10);
      fVar17 = *(float *)((long)&OpticalFlowPatch<float,vo::Pattern51<float>>::pattern2 + lVar10 + 4
                         );
      fVar3 = *(float *)((long)&DAT_001446e8 + lVar10);
      fVar4 = *(float *)((long)&DAT_001446e8 + lVar10 + 4);
      fVar5 = *(float *)(&DAT_001446f0 + lVar10);
      fVar6 = *(float *)(lVar10 + 0x1446f4);
      fVar7 = *(float *)(lVar10 + 0x1446f8);
      fVar8 = *(float *)(lVar10 + 0x1446fc);
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 0x10) = fVar15 * fVar6 + fVar12 * fVar5;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 0x14) = fVar6 * fVar13 + fVar5 * fVar14;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 0x18) = fVar15 * fVar8 + fVar12 * fVar7;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 0x1c) = fVar8 * fVar13 + fVar7 * fVar14;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10) = fVar15 * fVar17 + fVar12 * fVar16;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 4) = fVar17 * fVar13 + fVar16 * fVar14;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 8) = fVar15 * fVar4 + fVar12 * fVar3;
      *(float *)((long)local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                       m_storage.m_data.array + lVar10 + 0xc) = fVar4 * fVar13 + fVar3 * fVar14;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x1a0);
    fVar12 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[4];
    fVar13 = (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array[5];
    lVar10 = 0;
    do {
      fVar14 = local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.
               m_data.array[lVar10 * 2U + 1];
      fVar15 = local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.
               m_data.array[lVar10 * 2U + 2];
      fVar16 = local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.
               m_data.array[lVar10 * 2U + 3];
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar10 * 2] = local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.
                     m_storage.m_data.array[lVar10 * 2] + fVar12;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar10 * 2U + 1] = fVar14 + fVar13;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar10 * 2U + 2] = fVar15 + fVar12;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<float,_2,_52,_0,_2,_52>_>.m_storage.m_data.array
      [lVar10 * 2U + 3] = fVar16 + fVar13;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0x34);
    bVar9 = OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
                      (local_330,img_2,&local_2a8,&local_108);
    if (!bVar9) {
      return false;
    }
    local_2f8 = local_338;
    local_2d8 = local_338;
    local_2c8 = 0x34;
    local_320.data = (float *)&local_2b4;
    local_318 = (undefined1  [8])&local_320;
    local_308 = &local_339;
    local_328 = uVar11;
    uStack_310 = (SO2Base<Sophus::SO2<float,_0>_> *)&local_2f8;
    local_300 = (DstXprType *)local_320.data;
    local_2e8 = &local_108;
    local_2d0 = &local_108;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_52,_0,_3,_52>_>,_Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_318);
    Sophus::SE2Base<Sophus::SE2<float,_0>_>::exp((SE2Base<Sophus::SE2<float,_0>_> *)local_318,__x);
    Sophus::SO2Base<Sophus::SO2<float,_0>_>::matrix((SO2Base<Sophus::SO2<float,_0>_> *)&local_2f8);
    uVar1 = *(undefined8 *)
             (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
             m_storage.m_data.array;
    uVar2 = *(undefined8 *)
             ((transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array + 2);
    fVar14 = (float)uVar2;
    fVar15 = (float)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)
             ((transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
              m_storage.m_data.array + 4);
    fVar16 = (float)uVar1;
    fVar17 = (float)((ulong)uVar1 >> 0x20);
    fVar12 = (float)uVar2;
    fVar13 = (float)((ulong)uVar2 >> 0x20);
    (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
    m_data.array[0] = local_2f8._4_4_ * fVar14 + fVar12 * 0.0 + (float)local_2f8 * fVar16;
    (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
    m_data.array[1] = local_2f8._4_4_ * fVar15 + fVar13 * 0.0 + (float)local_2f8 * fVar17;
    (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
    m_data.array[2] = fStack_2ec * fVar14 + fVar12 * 0.0 + fStack_2f0 * fVar16;
    (transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.
    m_data.array[3] = fStack_2ec * fVar15 + fVar13 * 0.0 + fStack_2f0 * fVar17;
    fVar12 = uStack_310._4_4_ * fVar14 + fVar12 + (float)uStack_310 * fVar16;
    fVar13 = uStack_310._4_4_ * fVar15 + fVar13 + (float)uStack_310 * fVar17;
    *(ulong *)((transform->m_matrix).super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.
               m_storage.m_data.array + 4) = CONCAT44(fVar13,fVar12);
    if (fVar12 < 2.0) {
      return false;
    }
    if ((float)(int)img_2->w + -2.0 + -1.0 <= fVar12) break;
    if (fVar13 < 2.0) {
      return false;
    }
    fVar12 = (float)(int)img_2->h + -2.0 + -1.0;
    if (fVar12 <= fVar13) {
      return fVar13 < fVar12;
    }
    uVar11 = (ulong)((uint)local_328 + 1);
    if (3 < (uint)local_328) {
      return fVar13 < fVar12;
    }
  }
  return false;
}

Assistant:

inline bool trackPointAtLevel(const Image<const u_int16_t>& img_2,
                                const PatchT& dp,
                                Eigen::AffineCompact2f& transform) const {
    bool patch_valid = true;

    for (int iteration = 0;
         patch_valid && iteration < optical_flow_max_iterations; iteration++) {
      typename PatchT::VectorP res;

      typename PatchT::Matrix2P transformed_pat =
          transform.linear().matrix() * PatchT::pattern2;
      transformed_pat.colwise() += transform.translation();

      bool valid = dp.residual(img_2, transformed_pat, res);

      if (valid) {
        Vector3 inc = -dp.H_se2_inv_J_se2_T * res;
        transform *= SE2::exp(inc).matrix();

        const int filter_margin = 2;

        if (!img_2.InBounds(transform.translation(), filter_margin))
          patch_valid = false;
      } else {
        patch_valid = false;
      }
    }

    return patch_valid;
  }